

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Qualifiers __thiscall anon_unknown.dwarf_153ab3::Db::parseCVQualifiers(Db *this)

{
  bool bVar1;
  Qualifiers local_14;
  Db *pDStack_10;
  Qualifiers CVR;
  Db *this_local;
  
  local_14 = QualNone;
  pDStack_10 = this;
  bVar1 = consumeIf(this,'r');
  if (bVar1) {
    addQualifiers(&local_14,QualRestrict);
  }
  bVar1 = consumeIf(this,'V');
  if (bVar1) {
    addQualifiers(&local_14,QualVolatile);
  }
  bVar1 = consumeIf(this,'K');
  if (bVar1) {
    addQualifiers(&local_14,QualConst);
  }
  return local_14;
}

Assistant:

Qualifiers Db::parseCVQualifiers() {
  Qualifiers CVR = QualNone;
  if (consumeIf('r'))
    addQualifiers(CVR, QualRestrict);
  if (consumeIf('V'))
    addQualifiers(CVR, QualVolatile);
  if (consumeIf('K'))
    addQualifiers(CVR, QualConst);
  return CVR;
}